

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowViewport(ImGuiWindow_conflict *window,ImGuiViewportP_conflict1 *viewport)

{
  ImVec2 local_20;
  ImGuiViewportP_conflict1 *local_18;
  ImGuiViewportP_conflict1 *viewport_local;
  ImGuiWindow_conflict *window_local;
  
  local_18 = viewport;
  viewport_local = (ImGuiViewportP_conflict1 *)window;
  if (((window->ViewportOwned & 1U) != 0) && (window->Viewport->Window == window)) {
    ImVec2::ImVec2(&local_20,0.0,0.0);
    ((viewport_local->super_ImGuiViewport).DrawData)->CmdLists = (ImDrawList **)local_20;
  }
  (viewport_local->super_ImGuiViewport).DrawData = (ImDrawData_conflict1 *)local_18;
  *(ImGuiID *)&(viewport_local->super_ImGuiViewport).RendererUserData =
       (local_18->super_ImGuiViewport).ID;
  *(bool *)((long)&(viewport_local->DrawDataP).DisplaySize.y + 2) =
       local_18->Window == (ImGuiWindow_conflict *)viewport_local;
  return;
}

Assistant:

static void SetWindowViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    // Abandon viewport
    if (window->ViewportOwned && window->Viewport->Window == window)
        window->Viewport->Size = ImVec2(0.0f, 0.0f);

    window->Viewport = viewport;
    window->ViewportId = viewport->ID;
    window->ViewportOwned = (viewport->Window == window);
}